

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O1

ostream * Gs::operator<<(ostream *stream,Matrix<float,_3UL,_3UL> *mat)

{
  ulong uVar1;
  byte bVar2;
  undefined1 uVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  size_t c;
  long lVar7;
  float *pfVar8;
  size_t lengths [3];
  char *local_78;
  long local_70;
  char local_68 [16];
  long local_58;
  float *local_50;
  ulong auStack_48 [3];
  
  lVar7 = 0;
  pfVar8 = mat->m_;
  do {
    auStack_48[lVar7] = 0;
    lVar6 = 0;
    do {
      sVar4 = Details::Length<float>((float *)((long)pfVar8 + lVar6));
      if (sVar4 < auStack_48[lVar7]) {
        sVar4 = auStack_48[lVar7];
      }
      auStack_48[lVar7] = sVar4;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    lVar7 = lVar7 + 1;
    pfVar8 = pfVar8 + 3;
  } while (lVar7 != 3);
  local_58 = 0;
  do {
    bVar2 = (local_58 != 2) << 5 | 0x5c;
    if (local_58 == 0) {
      bVar2 = 0x2f;
    }
    local_78._0_1_ = bVar2;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_78,1);
    lVar7 = 0;
    local_50 = mat->m_;
    do {
      uVar1 = auStack_48[lVar7];
      sVar4 = Details::Length<float>(mat->m_);
      local_78 = local_68;
      std::__cxx11::string::_M_construct((ulong)&local_78,((char)uVar1 - (char)sVar4) + '\x01');
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_78,local_70);
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      poVar5 = std::ostream::_M_insert<double>((double)mat->m_[0]);
      local_78._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_78,1);
      lVar6 = local_58;
      lVar7 = lVar7 + 1;
      mat = (Matrix<float,_3UL,_3UL> *)((long)mat + 0xc);
    } while (lVar7 != 3);
    uVar3 = 0x7c;
    if (local_58 == 2) {
      uVar3 = 0x2f;
    }
    if (local_58 == 0) {
      uVar3 = 0x5c;
    }
    local_78 = (char *)CONCAT71(local_78._1_7_,uVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_78,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_58 = lVar6 + 1;
    mat = (Matrix<float,_3UL,_3UL> *)(local_50 + 1);
  } while (local_58 != 3);
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}